

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

char * Diligent::GetShaderCodeBasicTypeString(SHADER_CODE_BASIC_TYPE Type)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  SHADER_CODE_BASIC_TYPE Type_local;
  
  switch(Type) {
  case SHADER_CODE_BASIC_TYPE_UNKNOWN:
    pcStack_10 = "unknown";
    break;
  case SHADER_CODE_BASIC_TYPE_VOID:
    pcStack_10 = "void";
    break;
  case SHADER_CODE_BASIC_TYPE_BOOL:
    pcStack_10 = "bool";
    break;
  case SHADER_CODE_BASIC_TYPE_INT:
    pcStack_10 = "int";
    break;
  case SHADER_CODE_BASIC_TYPE_INT8:
    pcStack_10 = "int8";
    break;
  case SHADER_CODE_BASIC_TYPE_INT16:
    pcStack_10 = "int16";
    break;
  case SHADER_CODE_BASIC_TYPE_INT64:
    pcStack_10 = "int64";
    break;
  case SHADER_CODE_BASIC_TYPE_UINT:
    pcStack_10 = "uint";
    break;
  case SHADER_CODE_BASIC_TYPE_UINT8:
    pcStack_10 = "uint8";
    break;
  case SHADER_CODE_BASIC_TYPE_UINT16:
    pcStack_10 = "uint16";
    break;
  case SHADER_CODE_BASIC_TYPE_UINT64:
    pcStack_10 = "uint64";
    break;
  case SHADER_CODE_BASIC_TYPE_FLOAT:
    pcStack_10 = "float";
    break;
  case SHADER_CODE_BASIC_TYPE_FLOAT16:
    pcStack_10 = "float16";
    break;
  case SHADER_CODE_BASIC_TYPE_DOUBLE:
    pcStack_10 = "double";
    break;
  case SHADER_CODE_BASIC_TYPE_MIN8FLOAT:
    pcStack_10 = "min8float";
    break;
  case SHADER_CODE_BASIC_TYPE_MIN10FLOAT:
    pcStack_10 = "min10float";
    break;
  case SHADER_CODE_BASIC_TYPE_MIN16FLOAT:
    pcStack_10 = "min16float";
    break;
  case SHADER_CODE_BASIC_TYPE_MIN12INT:
    pcStack_10 = "min12int";
    break;
  case SHADER_CODE_BASIC_TYPE_MIN16INT:
    pcStack_10 = "min16int";
    break;
  case SHADER_CODE_BASIC_TYPE_MIN16UINT:
    pcStack_10 = "min16uint";
    break;
  case SHADER_CODE_BASIC_TYPE_STRING:
    pcStack_10 = "string";
    break;
  default:
    msg.field_2._M_local_buf[0xf] = Type;
    FormatString<char[35]>((string *)local_38,(char (*) [35])"Unknown/unsupported variable class");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetShaderCodeBasicTypeString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x6b3);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const char* GetShaderCodeBasicTypeString(SHADER_CODE_BASIC_TYPE Type)
{
    static_assert(SHADER_CODE_BASIC_TYPE_COUNT == 21, "Did you add a new type? Please update the switch below.");
    switch (Type)
    {
        // clang-format off
        case SHADER_CODE_BASIC_TYPE_UNKNOWN:    return "unknown";
        case SHADER_CODE_BASIC_TYPE_VOID:       return "void";
        case SHADER_CODE_BASIC_TYPE_BOOL:       return "bool";
        case SHADER_CODE_BASIC_TYPE_INT:        return "int";
        case SHADER_CODE_BASIC_TYPE_INT8:       return "int8";
        case SHADER_CODE_BASIC_TYPE_INT16:      return "int16";
        case SHADER_CODE_BASIC_TYPE_INT64:      return "int64";
        case SHADER_CODE_BASIC_TYPE_UINT:       return "uint";
        case SHADER_CODE_BASIC_TYPE_UINT8:      return "uint8";
        case SHADER_CODE_BASIC_TYPE_UINT16:     return "uint16";
        case SHADER_CODE_BASIC_TYPE_UINT64:     return "uint64";
        case SHADER_CODE_BASIC_TYPE_FLOAT:      return "float";
        case SHADER_CODE_BASIC_TYPE_FLOAT16:    return "float16";
        case SHADER_CODE_BASIC_TYPE_DOUBLE:     return "double";
        case SHADER_CODE_BASIC_TYPE_MIN8FLOAT:  return "min8float";
        case SHADER_CODE_BASIC_TYPE_MIN10FLOAT: return "min10float";
        case SHADER_CODE_BASIC_TYPE_MIN16FLOAT: return "min16float";
        case SHADER_CODE_BASIC_TYPE_MIN12INT:   return "min12int";
        case SHADER_CODE_BASIC_TYPE_MIN16INT:   return "min16int";
        case SHADER_CODE_BASIC_TYPE_MIN16UINT:  return "min16uint";
        case SHADER_CODE_BASIC_TYPE_STRING:     return "string";
        // clang-format on
        default: UNEXPECTED("Unknown/unsupported variable class"); return "UNKNOWN";
    }
}